

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O3

void __thiscall TextFile::~TextFile(TextFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int in_ESI;
  
  close(this,in_ESI);
  pcVar2 = (this->buf)._M_dataplus._M_p;
  paVar1 = &(this->buf).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->content)._M_dataplus._M_p;
  paVar1 = &(this->content).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->errorText)._M_dataplus._M_p;
  paVar1 = &(this->errorText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ghc::filesystem::path::~path(&this->fileName);
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> = 0x1bcbd8;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x108 =
       0x1bcc28;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x10 =
       0x1bcc00;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->stream).super_basic_fstream<char,_std::char_traits<char>_>._M_filebuf);
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> = 0x1bccc8;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x108 =
       0x1bccf0;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x8 = 0;
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x108);
  return;
}

Assistant:

TextFile::~TextFile()
{
	close();
}